

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::SetForcedPackagePrefix(objectivec *this,string_view prefix)

{
  string_view prefix_00;
  string_view prefix_local;
  
  prefix_00._M_str = (char *)prefix._M_len;
  prefix_00._M_len = (size_t)this;
  anon_unknown_0::PrefixModeStorage::set_forced_package_prefix
            ((anonymous_namespace)::g_prefix_mode,prefix_00);
  return;
}

Assistant:

void SetForcedPackagePrefix(absl::string_view prefix) {
  g_prefix_mode.set_forced_package_prefix(prefix);
}